

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

Symbol * __thiscall SymbolTable::cSearch(SymbolTable *this,char *lexeme)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Symbol *pSVar8;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (lexeme != (char *)0x0) {
    local_40 = local_30;
    sVar4 = strlen(lexeme);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,lexeme,lexeme + sVar4);
    if (local_38 == 0) {
      uVar7 = 0;
    }
    else {
      lVar5 = 1;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = (uVar7 + ((long)(char)local_40[lVar6] + -0x60) * lVar5) % 0x3b9aca09;
        lVar5 = (lVar5 * 0xad) % 0x3b9aca09;
        lVar6 = lVar6 + 1;
      } while (local_38 != lVar6);
      iVar2 = (int)(uVar7 * 0x446f8657 >> 0x20);
      uVar7 = (ulong)((int)uVar7 + (((uint)((int)uVar7 - iVar2) >> 1) + iVar2 >> 6) * -0x65);
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    pSVar8 = this->block[uVar7];
    if (pSVar8 != (Symbol *)0x0) {
      pcVar1 = this->lexemeArray;
      do {
        iVar2 = pSVar8->lexemeIndex;
        iVar3 = strcmp(pcVar1 + iVar2,lexeme);
        if (iVar3 == 0) {
          pSVar8->lexeme = pcVar1 + iVar2;
          return pSVar8;
        }
        pSVar8 = pSVar8->nextSymbol;
      } while (pSVar8 != (Symbol *)0x0);
    }
  }
  return (Symbol *)0x0;
}

Assistant:

Symbol *SymbolTable::cSearch(const char *lexeme) {
    if (lexeme != nullptr) {
        unsigned long pos = cHash(lexeme);
        Symbol *temp = block[pos];
        while (temp != nullptr) {

            if (strcmp(lexemeArray + temp->getLexemeIndex(), lexeme) == 0) {
                temp->setLexeme(lexemeArray + temp->getLexemeIndex());
                return temp;
            }
            temp = temp->getNextSymbol();
        }
        return nullptr;
    }
    return nullptr;
}